

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O3

int pps_range_extensions(GetBitContext *gb,HEVCPPS *pps)

{
  uint8_t uVar1;
  byte bVar2;
  uint uVar3;
  uint8_t *puVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  if (pps->transform_skip_enabled_flag != '\0') {
    uVar6 = get_ue_golomb_long(gb);
    pps->log2_max_transform_skip_block_size = (char)uVar6 + '\x02';
  }
  uVar6 = gb->index;
  puVar4 = gb->buffer;
  uVar3 = gb->size_in_bits_plus8;
  uVar1 = puVar4[uVar6 >> 3];
  uVar7 = uVar6 + (uVar6 < uVar3);
  gb->index = uVar7;
  pps->cross_component_prediction_enabled_flag = (byte)(uVar1 << ((byte)uVar6 & 7)) >> 7;
  bVar2 = puVar4[uVar7 >> 3];
  gb->index = uVar6 + (uVar6 < uVar3) + (uint)(uVar7 < uVar3);
  uVar6 = ((uint)bVar2 << ((byte)uVar7 & 7)) >> 7 & 1;
  pps->chroma_qp_offset_list_enabled_flag = (uint8_t)uVar6;
  if (uVar6 != 0) {
    uVar6 = get_ue_golomb_long(gb);
    pps->diff_cu_chroma_qp_offset_depth = (uint8_t)uVar6;
    uVar6 = get_ue_golomb_long(gb);
    pps->chroma_qp_offset_list_len_minus1 = (uint8_t)uVar6;
    if (4 < (uVar6 & 0xff)) {
      pps_range_extensions_cold_1();
      return -1;
    }
    uVar8 = 0xffffffffffffffff;
    do {
      uVar6 = get_ue_golomb_long(gb);
      cVar5 = ((byte)(uVar6 >> 1) ^ ((byte)uVar6 & 1) - 1) + 1;
      pps->cb_qp_offset_list[uVar8 + 1] = cVar5;
      if (cVar5 != '\0') {
        pps_range_extensions_cold_2();
      }
      uVar6 = get_ue_golomb_long(gb);
      cVar5 = ((byte)(uVar6 >> 1) ^ ((byte)uVar6 & 1) - 1) + 1;
      pps->cr_qp_offset_list[uVar8 + 1] = cVar5;
      if (cVar5 != '\0') {
        pps_range_extensions_cold_3();
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < pps->chroma_qp_offset_list_len_minus1);
  }
  uVar6 = get_ue_golomb_long(gb);
  pps->log2_sao_offset_scale_luma = (uint8_t)uVar6;
  uVar6 = get_ue_golomb_long(gb);
  pps->log2_sao_offset_scale_chroma = (uint8_t)uVar6;
  return 0;
}

Assistant:

static int pps_range_extensions(GetBitContext *gb, HEVCPPS *pps)
{
    int i;

    if (pps->transform_skip_enabled_flag)
        pps->log2_max_transform_skip_block_size = (uint8_t)(get_ue_golomb_long(gb) + 2);
    pps->cross_component_prediction_enabled_flag = (uint8_t)get_bits1(gb);
    pps->chroma_qp_offset_list_enabled_flag = (uint8_t)get_bits1(gb);
    if (pps->chroma_qp_offset_list_enabled_flag) {
        pps->diff_cu_chroma_qp_offset_depth = (uint8_t)get_ue_golomb_long(gb);
        pps->chroma_qp_offset_list_len_minus1 = (uint8_t)get_ue_golomb_long(gb);
        if (pps->chroma_qp_offset_list_len_minus1 && pps->chroma_qp_offset_list_len_minus1 >= 5)
        {
            fprintf(stderr, "chroma_qp_offset_list_len_minus1 shall be in the range [0, 5].\n");
            return -1;
        }
        for (i = 0; i <= pps->chroma_qp_offset_list_len_minus1; i++)
        {
            pps->cb_qp_offset_list[i] = (int8_t)get_se_golomb_long(gb);
            if (pps->cb_qp_offset_list[i])
                fprintf(stderr, "cb_qp_offset_list not tested yet.\n");
            pps->cr_qp_offset_list[i] = (int8_t)get_se_golomb_long(gb);
            if (pps->cr_qp_offset_list[i])
                fprintf(stderr, "cb_qp_offset_list not tested yet.\n");
        }
    }
    pps->log2_sao_offset_scale_luma = (uint8_t)get_ue_golomb_long(gb);
    pps->log2_sao_offset_scale_chroma = (uint8_t)get_ue_golomb_long(gb);

    return 0;
}